

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::getsteinerptonsegment(tetgenmesh *this,face *seg,point refpt,point steinpt)

{
  int iVar1;
  shellface *pppdVar2;
  shellface e1;
  shellface e2;
  point *ppdVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  
  pppdVar2 = seg->sh;
  e1 = pppdVar2[sorgpivot[seg->shver]];
  e2 = pppdVar2[sdestpivot[seg->shver]];
  if (refpt == (point)0x0) {
    lVar6 = 0;
    do {
      steinpt[lVar6] = ((double)e2[lVar6] - (double)e1[lVar6]) * 0.5 + (double)e1[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    return 0;
  }
  if ((*(uint *)((long)refpt + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0x600) {
    iVar8 = *(int *)(((ulong)refpt[(long)this->point2simindex + 2] & 0xfffffffffffffff8) + 8 +
                    (long)this->shmarkindex * 4);
    ppdVar3 = this->segmentendpointslist;
    iVar1 = *(int *)((long)pppdVar2 + (long)this->shmarkindex * 4 + 8);
    pdVar4 = ppdVar3[(long)iVar1 * 2];
    uVar7 = iVar1 * 2 + 1;
    this = (tetgenmesh *)(ulong)uVar7;
    pdVar5 = ppdVar3[(int)uVar7];
    if ((ppdVar3[(long)iVar8 * 2] == pdVar4) || (ppdVar3[iVar8 * 2 + 1] == pdVar4)) {
      dVar9 = (pdVar5[2] - pdVar4[2]) * (pdVar5[2] - pdVar4[2]) +
              (*pdVar5 - *pdVar4) * (*pdVar5 - *pdVar4) +
              (pdVar5[1] - pdVar4[1]) * (pdVar5[1] - pdVar4[1]);
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar10 = (refpt[2] - pdVar4[2]) * (refpt[2] - pdVar4[2]) +
               (*refpt - *pdVar4) * (*refpt - *pdVar4) +
               (refpt[1] - pdVar4[1]) * (refpt[1] - pdVar4[1]);
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      lVar6 = 0;
      do {
        steinpt[lVar6] = (pdVar5[lVar6] - pdVar4[lVar6]) * (dVar10 / dVar9) + pdVar4[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
    }
    else {
      if ((ppdVar3[(long)iVar8 * 2] != pdVar5) && (ppdVar3[iVar8 * 2 + 1] != pdVar5))
      goto LAB_0012c90a;
      dVar9 = (pdVar5[2] - pdVar4[2]) * (pdVar5[2] - pdVar4[2]) +
              (*pdVar5 - *pdVar4) * (*pdVar5 - *pdVar4) +
              (pdVar5[1] - pdVar4[1]) * (pdVar5[1] - pdVar4[1]);
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar10 = (refpt[2] - pdVar5[2]) * (refpt[2] - pdVar5[2]) +
               (*refpt - *pdVar5) * (*refpt - *pdVar5) +
               (refpt[1] - pdVar5[1]) * (refpt[1] - pdVar5[1]);
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      lVar6 = 0;
      do {
        steinpt[lVar6] = (pdVar4[lVar6] - pdVar5[lVar6]) * (dVar10 / dVar9) + pdVar5[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
    }
    iVar8 = 1;
  }
  else {
LAB_0012c90a:
    projpt2edge(this,refpt,(double *)e1,(double *)e2,steinpt);
    iVar8 = 0;
  }
  dVar9 = ((double)e2[2] - (double)e1[2]) * ((double)e2[2] - (double)e1[2]) +
          ((double)*e2 - (double)*e1) * ((double)*e2 - (double)*e1) +
          ((double)e2[1] - (double)e1[1]) * ((double)e2[1] - (double)e1[1]);
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  dVar10 = ((double)e1[2] - steinpt[2]) * ((double)e1[2] - steinpt[2]) +
           ((double)*e1 - *steinpt) * ((double)*e1 - *steinpt) +
           ((double)e1[1] - steinpt[1]) * ((double)e1[1] - steinpt[1]);
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  if ((dVar10 / dVar9 < 0.2) || (0.8 < dVar10 / dVar9)) {
    lVar6 = 0;
    do {
      steinpt[lVar6] = ((double)e2[lVar6] - (double)e1[lVar6]) * 0.5 + (double)e1[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
  }
  return iVar8;
}

Assistant:

int tetgenmesh::getsteinerptonsegment(face* seg, point refpt, point steinpt)
{
  point ei = sorg(*seg);
  point ej = sdest(*seg);
  int adjflag = 0, i;

  if (refpt != NULL) {
    REAL L, L1, t;
  
    if (pointtype(refpt) == FREESEGVERTEX) {
      face parentseg;
      sdecode(point2sh(refpt), parentseg);
      int sidx1 = getfacetindex(parentseg);
      point far_pi = segmentendpointslist[sidx1 * 2];
      point far_pj = segmentendpointslist[sidx1 * 2 + 1];
      int sidx2 = getfacetindex(*seg);
      point far_ei = segmentendpointslist[sidx2 * 2];
      point far_ej = segmentendpointslist[sidx2 * 2 + 1];
      if ((far_pi == far_ei) || (far_pj == far_ei)) {
        // Create a Steiner point at the intersection of the segment
        //   [far_ei, far_ej] and the sphere centered at far_ei with 
        //   radius |far_ei - refpt|.
        L = distance(far_ei, far_ej);
        L1 = distance(far_ei, refpt);
        t = L1 / L;
        for (i = 0; i < 3; i++) {
          steinpt[i] = far_ei[i] + t * (far_ej[i] - far_ei[i]);
        }
        adjflag = 1;
      } else if ((far_pi == far_ej) || (far_pj == far_ej)) {
        L = distance(far_ei, far_ej);
        L1 = distance(far_ej, refpt);
        t = L1 / L;
        for (i = 0; i < 3; i++) {
          steinpt[i] = far_ej[i] + t * (far_ei[i] - far_ej[i]);
        }
        adjflag = 1;
      } else {
        // Cut the segment by the projection point of refpt.
        projpt2edge(refpt, ei, ej, steinpt);
      }
    } else {
      // Cut the segment by the projection point of refpt.
      projpt2edge(refpt, ei, ej, steinpt);
    }

    // Make sure that steinpt is not too close to ei and ej.
    L = distance(ei, ej);
    L1 = distance(steinpt, ei);
    t = L1 / L;
    if ((t < 0.2) || (t > 0.8)) {
      // Split the point at the middle.
      for (i = 0; i < 3; i++) {
        steinpt[i] = ei[i] + 0.5 * (ej[i] - ei[i]);
      }
    }
  } else {
    // Split the point at the middle.
    for (i = 0; i < 3; i++) {
      steinpt[i] = ei[i] + 0.5 * (ej[i] - ei[i]);
    }
  }


  return adjflag;
}